

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

ExprNode * parse_atom(ParserState *ps)

{
  ptrlen input;
  ptrlen errloc;
  bool bVar1;
  _Bool _Var2;
  char *pcVar3;
  void *pvVar4;
  ExprNode *pEVar5;
  void *pvVar6;
  ptrlen pVar7;
  ptrlen pVar8;
  ExprNode *en_2;
  ptrlen pl_hi;
  ptrlen pl_lo;
  _Bool parse_ok;
  char *minus;
  uint hi;
  uint lo;
  undefined1 local_98 [8];
  ptrlen tail;
  ExprNode *en_1;
  ExprNode *en;
  ExprNode *subexpr_1;
  ptrlen notloc;
  size_t local_48;
  ptrlen closepar;
  ExprNode *subexpr;
  ptrlen openpar;
  ParserState *ps_local;
  
  if (ps->tok == TOK_LPAR) {
    pvVar6 = (ps->toktext).ptr;
    advance(ps);
    ps_local = (ParserState *)parse_expr(ps);
    if (ps_local == (ParserState *)0x0) {
      ps_local = (ParserState *)0x0;
    }
    else if (ps->tok == TOK_RPAR) {
      pVar7 = ps->toktext;
      advance(ps);
      pvVar4 = ptrlen_end(pVar7);
      pVar7 = make_ptrlen_startend(pvVar6,pvVar4);
      notloc.len = (size_t)pVar7.ptr;
      ((ptrlen *)&(ps_local->currtext).len)->ptr = (void *)notloc.len;
      local_48 = pVar7.len;
      *(size_t *)&ps_local->tok = local_48;
    }
    else {
      pcVar3 = dupstr("expected \')\' after parenthesised subexpression");
      error(ps,pcVar3,*(ptrlen *)&(ps_local->currtext).len);
      exprnode_free((ExprNode *)ps_local);
      ps_local = (ParserState *)0x0;
    }
  }
  else if (ps->tok == TOK_NOT) {
    pvVar6 = (ps->toktext).ptr;
    advance(ps);
    pEVar5 = parse_atom(ps);
    if (pEVar5 == (ExprNode *)0x0) {
      ps_local = (ParserState *)0x0;
    }
    else {
      pvVar4 = ptrlen_end(pEVar5->text);
      pVar7 = make_ptrlen_startend(pvVar6,pvVar4);
      ps_local = (ParserState *)exprnode_new(OP_NOT,pVar7);
      (((anon_union_16_4_9062a603_for_ExprNode_2 *)&ps_local->toktext)->field_0).subexprs =
           (ExprNode **)pEVar5;
    }
  }
  else {
    if (ps->tok == TOK_ATOM) {
      _Var2 = atom_is_hostname_wc(ps->toktext);
      if (_Var2) {
        tail.len = (size_t)exprnode_new(OP_HOSTNAME_WC,ps->toktext);
        pcVar3 = mkstr(ps->toktext);
        *(char **)(tail.len + 0x18) = pcVar3;
        advance(ps);
        return (ExprNode *)tail.len;
      }
      pVar7 = make_ptrlen("port:",5);
      _Var2 = ptrlen_startswith(ps->toktext,pVar7,(ptrlen *)local_98);
      if (_Var2) {
        bVar1 = false;
        if ((tail.ptr == (void *)0x0) ||
           (pVar7.len = (size_t)tail.ptr, pVar7.ptr = (void *)local_98,
           _Var2 = ptrlen_contains_only(pVar7,"0123456789"), !_Var2)) {
          pvVar6 = memchr((void *)local_98,0x2d,(size_t)tail.ptr);
          if (pvVar6 != (void *)0x0) {
            pVar7 = make_ptrlen_startend((void *)local_98,pvVar6);
            pVar8.len = (size_t)tail.ptr;
            pVar8.ptr = (void *)local_98;
            pvVar4 = ptrlen_end(pVar8);
            pVar8 = make_ptrlen_startend((void *)((long)pvVar6 + 1),pvVar4);
            pl_lo.ptr = (void *)pVar7.len;
            if ((((pl_lo.ptr != (void *)0x0) &&
                 (_Var2 = ptrlen_contains_only(pVar7,"0123456789"), _Var2)) &&
                (pl_hi.ptr = (void *)pVar8.len, pl_hi.ptr != (void *)0x0)) &&
               (_Var2 = ptrlen_contains_only(pVar8,"0123456789"), _Var2)) {
              minus._4_4_ = ptrlen_to_port_number(pVar7);
              if (0xffff < minus._4_4_) {
                pcVar3 = dupstr("port number too large");
                error(ps,pcVar3,pVar7);
                return (ExprNode *)0x0;
              }
              minus._0_4_ = ptrlen_to_port_number(pVar8);
              if (0xffff < (uint)minus) {
                pcVar3 = dupstr("port number too large");
                error(ps,pcVar3,pVar8);
                return (ExprNode *)0x0;
              }
              if ((uint)minus < minus._4_4_) {
                pcVar3 = dupstr("port number range is backwards");
                pl_hi.len = (size_t)pVar7.ptr;
                pvVar6 = ptrlen_end(pVar8);
                pVar7 = make_ptrlen_startend((void *)pl_hi.len,pvVar6);
                error(ps,pcVar3,pVar7);
                return (ExprNode *)0x0;
              }
              bVar1 = true;
            }
          }
        }
        else {
          input.len = (size_t)tail.ptr;
          input.ptr = (void *)local_98;
          minus._0_4_ = ptrlen_to_port_number(input);
          if (0xffff < (uint)minus) {
            pcVar3 = dupstr("port number too large");
            errloc.len = (size_t)tail.ptr;
            errloc.ptr = (void *)local_98;
            error(ps,pcVar3,errloc);
            return (ExprNode *)0x0;
          }
          bVar1 = true;
          minus._4_4_ = (uint)minus;
        }
        if (!bVar1) {
          pcVar3 = dupstr("unable to parse port number specification");
          error(ps,pcVar3,ps->toktext);
          return (ExprNode *)0x0;
        }
        pEVar5 = exprnode_new(OP_PORT_RANGE,ps->toktext);
        (pEVar5->field_2).field_3.lo = minus._4_4_;
        (pEVar5->field_2).field_3.hi = (uint)minus;
        advance(ps);
        return pEVar5;
      }
    }
    pcVar3 = dupstr("expected a predicate or a parenthesised subexpression");
    error(ps,pcVar3,ps->toktext);
    ps_local = (ParserState *)0x0;
  }
  return (ExprNode *)ps_local;
}

Assistant:

static ExprNode *parse_atom(ParserState *ps)
{
    if (ps->tok == TOK_LPAR) {
        ptrlen openpar = ps->toktext;
        advance(ps);                   /* eat the ( */

        ExprNode *subexpr = parse_expr(ps);
        if (!subexpr)
            return NULL;

        if (ps->tok != TOK_RPAR) {
            error(ps, dupstr("expected ')' after parenthesised subexpression"),
                  subexpr->text);
            exprnode_free(subexpr);
            return NULL;
        }

        ptrlen closepar = ps->toktext;
        advance(ps);                   /* eat the ) */

        /* We can reuse the existing AST node, but we need to extend
         * its bounds within the input expression to include the
         * parentheses */
        subexpr->text = make_ptrlen_startend(
            openpar.ptr, ptrlen_end(closepar));
        return subexpr;
    }

    if (ps->tok == TOK_NOT) {
        ptrlen notloc = ps->toktext;
        advance(ps);                   /* eat the ! */

        ExprNode *subexpr = parse_atom(ps);
        if (!subexpr)
            return NULL;

        ExprNode *en = exprnode_new(
            OP_NOT, make_ptrlen_startend(
                notloc.ptr, ptrlen_end(subexpr->text)));
        en->subexpr = subexpr;
        return en;
    }

    if (ps->tok == TOK_ATOM) {
        if (atom_is_hostname_wc(ps->toktext)) {
            /* Hostname wildcard. */
            ExprNode *en = exprnode_new(OP_HOSTNAME_WC, ps->toktext);
            en->wc = mkstr(ps->toktext);
            advance(ps);
            return en;
        }

        ptrlen tail;
        if (ptrlen_startswith(ps->toktext, PTRLEN_LITERAL("port:"), &tail)) {
            /* Port number (single or range). */
            unsigned lo, hi;
            char *minus;
            static const char DIGITS[] = "0123456789\0";
            bool parse_ok = false;

            if (tail.len > 0 && ptrlen_contains_only(tail, DIGITS)) {
                lo = ptrlen_to_port_number(tail);
                if (lo >= 65536) {
                    error(ps, dupstr("port number too large"), tail);
                    return NULL;
                }
                hi = lo;
                parse_ok = true;
            } else if ((minus = memchr(tail.ptr, '-', tail.len)) != NULL) {
                ptrlen pl_lo = make_ptrlen_startend(tail.ptr, minus);
                ptrlen pl_hi = make_ptrlen_startend(minus+1, ptrlen_end(tail));
                if (pl_lo.len > 0 && ptrlen_contains_only(pl_lo, DIGITS) &&
                    pl_hi.len > 0 && ptrlen_contains_only(pl_hi, DIGITS)) {

                    lo = ptrlen_to_port_number(pl_lo);
                    if (lo >= 65536) {
                        error(ps, dupstr("port number too large"), pl_lo);
                        return NULL;
                    }

                    hi = ptrlen_to_port_number(pl_hi);
                    if (hi >= 65536) {
                        error(ps, dupstr("port number too large"), pl_hi);
                        return NULL;
                    }

                    if (hi < lo) {
                        error(ps, dupstr("port number range is backwards"),
                              make_ptrlen_startend(pl_lo.ptr,
                                                   ptrlen_end(pl_hi)));
                        return NULL;
                    }

                    parse_ok = true;
                }
            }

            if (!parse_ok) {
                error(ps, dupstr("unable to parse port number specification"),
                      ps->toktext);
                return NULL;
            }


            ExprNode *en = exprnode_new(OP_PORT_RANGE, ps->toktext);
            en->lo = lo;
            en->hi = hi;
            advance(ps);
            return en;
        }
    }

    error(ps, dupstr("expected a predicate or a parenthesised subexpression"),
          ps->toktext);
    return NULL;
}